

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::makeResourcesIndirect(QPDFObjectHandle *this,QPDF *owning_qpdf)

{
  bool bVar1;
  reference ppVar2;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  reference local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *i2;
  iterator __end2;
  iterator __begin2;
  Dictionary *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *i1;
  _Self local_50;
  iterator __end1;
  _Self local_38;
  iterator __begin1;
  Dictionary *__range1;
  QPDF *owning_qpdf_local;
  QPDFObjectHandle *this_local;
  
  as_dictionary((QPDFObjectHandle *)&__begin1,(typed)this);
  local_38._M_node =
       (_Base_ptr)::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin1);
  local_50._M_node = (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin1);
  while( true ) {
    bVar1 = std::operator!=(&local_38,&local_50);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&local_38);
    as_dictionary((QPDFObjectHandle *)&__begin2,(char)ppVar2 + 0x20);
    __end2 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin2);
    i2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
          *)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin2);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&i2);
      if (!bVar1) break;
      local_90 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                 ::operator*(&__end2);
      bVar1 = ::qpdf::BaseHandle::null(&(local_90->second).super_BaseHandle);
      if (!bVar1) {
        bVar1 = isIndirect(&local_90->second);
        if (!bVar1) {
          QPDFObjectHandle(&local_b0,&local_90->second);
          QPDF::makeIndirectObject((QPDF *)&local_a0,(QPDFObjectHandle *)owning_qpdf);
          operator=(&local_90->second,&local_a0);
          ~QPDFObjectHandle(&local_a0);
          ~QPDFObjectHandle(&local_b0);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end2);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin2);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
    ::operator++(&local_38);
  }
  ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin1);
  return;
}

Assistant:

void
QPDFObjectHandle::makeResourcesIndirect(QPDF& owning_qpdf)
{
    for (auto const& i1: as_dictionary()) {
        for (auto& i2: i1.second.as_dictionary()) {
            if (!i2.second.null() && !i2.second.isIndirect()) {
                i2.second = owning_qpdf.makeIndirectObject(i2.second);
            }
        }
    }
}